

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

ON_Font * ON_Font::GetManagedFontFromPostScriptName(wchar_t *postscript_name)

{
  ON_FontList *pOVar1;
  undefined1 local_100 [8];
  ON_Font font;
  ON_Font *installed_font;
  ON_Font *managed_font;
  ON_wString local_20;
  ON_wString buffer;
  wchar_t *postscript_name_local;
  
  buffer.m_s = postscript_name;
  ON_wString::ON_wString(&local_20,postscript_name);
  ON_wString::TrimLeftAndRight(&local_20,(wchar_t *)0x0);
  buffer.m_s = ON_wString::operator_cast_to_wchar_t_(&local_20);
  if ((buffer.m_s == (wchar_t *)0x0) || (*buffer.m_s == L'\0')) {
    postscript_name_local = (wchar_t *)&Default;
  }
  else {
    pOVar1 = ManagedFontList();
    postscript_name_local = (wchar_t *)ON_FontList::FromPostScriptName(pOVar1,buffer.m_s);
    if ((ON_Font *)postscript_name_local == (ON_Font *)0x0) {
      pOVar1 = InstalledFontList();
      font.m_managed_installed_font_and_bits =
           (ON__UINT_PTR)ON_FontList::FromPostScriptName(pOVar1,buffer.m_s);
      if ((ON_Font *)font.m_managed_installed_font_and_bits == (ON_Font *)0x0) {
        ON_Font((ON_Font *)local_100,&Unset);
        SetFontWeight((ON_Font *)local_100,Normal);
        SetFontStretch((ON_Font *)local_100,Medium);
        SetFontStyle((ON_Font *)local_100,Upright);
        ON_wString::operator=(&font.m_locale_name,buffer.m_s);
        ON_wString::operator=(&font.m_loc_postscript_name,&font.m_locale_name);
        postscript_name_local = (wchar_t *)ManagedFont((ON_Font *)local_100);
        ~ON_Font((ON_Font *)local_100);
      }
      else {
        postscript_name_local =
             (wchar_t *)ManagedFont((ON_Font *)font.m_managed_installed_font_and_bits);
      }
    }
  }
  ON_wString::~ON_wString(&local_20);
  return (ON_Font *)postscript_name_local;
}

Assistant:

const ON_Font* ON_Font::GetManagedFontFromPostScriptName(
  const wchar_t* postscript_name
  )
{
  ON_wString buffer(postscript_name);
  buffer.TrimLeftAndRight();
  postscript_name = buffer;
  if (nullptr == postscript_name || 0 == postscript_name[0])
    return &ON_Font::Default;

  const ON_Font* managed_font = ON_Font::ManagedFontList().FromPostScriptName(postscript_name);
  if (nullptr != managed_font)
    return managed_font;

  const ON_Font* installed_font = ON_Font::InstalledFontList().FromPostScriptName(postscript_name);
  if (nullptr != installed_font)
    return installed_font->ManagedFont();

  // This font is not installed.
  ON_Font font(ON_Font::Unset);

  // preferred weight/stretch/style since this font is not installed
  font.SetFontWeight(ON_Font::Weight::Normal);
  font.SetFontStretch(ON_Font::Stretch::Medium);
  font.SetFontStyle(ON_Font::Style::Upright);
  font.m_loc_postscript_name = postscript_name;
  font.m_en_postscript_name = font.m_loc_postscript_name;

  return font.ManagedFont();
}